

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpClient.cpp
# Opt level: O1

void __thiscall HttpClient::HttpClient(HttpClient *this,Log *log)

{
  Log::Log(&this->_log);
  std::__cxx11::string::_M_assign((string *)this);
  (this->_log)._printFunction = log->_printFunction;
  return;
}

Assistant:

HttpClient::HttpClient(Log log) {
  _log = log;
}